

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_reporting.cc
# Opt level: O0

google * __thiscall
google::PrintStringFlagsWithQuotes(google *this,CommandLineFlagInfo *flag,string *text,bool current)

{
  int iVar1;
  char *__s1;
  undefined8 uVar2;
  undefined8 local_48;
  char *c_string;
  bool current_local;
  string *text_local;
  CommandLineFlagInfo *flag_local;
  
  if (current) {
    local_48 = std::__cxx11::string::c_str();
  }
  else {
    local_48 = std::__cxx11::string::c_str();
  }
  __s1 = (char *)std::__cxx11::string::c_str();
  iVar1 = strcmp(__s1,"string");
  if (iVar1 == 0) {
    uVar2 = std::__cxx11::string::c_str();
    StringPrintf_abi_cxx11_((char *)this,"%s: \"%s\"",uVar2,local_48);
  }
  else {
    uVar2 = std::__cxx11::string::c_str();
    StringPrintf_abi_cxx11_((char *)this,"%s: %s",uVar2,local_48);
  }
  return this;
}

Assistant:

static string PrintStringFlagsWithQuotes(const CommandLineFlagInfo& flag,
                                         const string& text, bool current) {
  const char* c_string = (current ? flag.current_value.c_str() :
                          flag.default_value.c_str());
  if (strcmp(flag.type.c_str(), "string") == 0) {  // add quotes for strings
    return StringPrintf("%s: \"%s\"", text.c_str(), c_string);
  } else {
    return StringPrintf("%s: %s", text.c_str(), c_string);
  }
}